

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CALLBACK::GarbageCollector
          (_Type_CALLBACK *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  ulong uVar2;
  Callback *pCVar3;
  Variable *this_00;
  Namer *this_01;
  long in_RCX;
  long *plVar4;
  code *local_78;
  Callback *c;
  offset_in_Memory_to_subr caller_local;
  Variable *object_local;
  _Type_CALLBACK *this_local;
  
  pOVar1 = Variable::operator->(object);
  plVar4 = (long *)((long)(pOVar1->memory->arr)._M_elems + in_RCX);
  local_78 = (code *)caller;
  if ((caller & 1) != 0) {
    local_78 = *(code **)(*plVar4 + (caller - 1));
  }
  pOVar1 = Variable::operator->(object);
  uVar2 = (*local_78)(plVar4,pOVar1->ID);
  if ((uVar2 & 1) == 0) {
    pOVar1 = Variable::operator->(object);
    pCVar3 = Object::GetData<LiteScript::Callback>(pOVar1);
    if ((*(pCVar3->This).isNull & 1U) == 0) {
      this_00 = Nullable<LiteScript::Variable>::operator->(&pCVar3->This);
      Variable::GarbageCollector(this_00,caller);
    }
    if ((*(pCVar3->nsp).isNull & 1U) == 0) {
      this_01 = Nullable<LiteScript::Namer>::operator->(&pCVar3->nsp);
      Namer::GarbageCollector(this_01,caller);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Callback& c = object->GetData<Callback>();
    if (!c.This.isNull)
        c.This->GarbageCollector(caller);
    if (!c.nsp.isNull)
        c.nsp->GarbageCollector(caller);
}